

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O1

Filter * __thiscall
helics::ConnectorFederateManager::getFilter(ConnectorFederateManager *this,string_view name)

{
  int iVar1;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar2;
  undefined1 *puVar3;
  BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
  filt;
  handle filts;
  BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
  local_48;
  handle local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_30,&this->filters);
  gmlc::containers::
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  ::find(&local_48,local_30.data,name);
  iVar1 = ((local_30.data)->dataStorage).bsize;
  ppuVar2 = ((local_30.data)->dataStorage).dataptr;
  if (iVar1 == 0x20) {
    if (ppuVar2 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
      ppuVar2 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                &gmlc::containers::
                 StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
                 ::end()::emptyValue;
    }
    else {
      ppuVar2 = ppuVar2 + (long)((local_30.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar1 = 0;
  }
  else {
    ppuVar2 = ppuVar2 + ((local_30.data)->dataStorage).dataSlotIndex;
  }
  if (((ppuVar2 == local_48.vec) ||
      ((((local_48.vec != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0
         && (ppuVar2 != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0))
        && (*local_48.vec == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)0x0
           )) && (*ppuVar2 ==
                  (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)0x0)))) &&
     (iVar1 == local_48.offset)) {
    puVar3 = invalidFiltNC;
  }
  else {
    puVar3 = (undefined1 *)
             ((local_48.ptr)->_M_t).
             super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
             super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
             super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_30.m_handle_lock);
  return (Filter *)puVar3;
}

Assistant:

Filter& ConnectorFederateManager::getFilter(std::string_view name)
{
    auto filts = filters.lock();
    auto filt = filts->find(name);
    return (filt != filts.end()) ? (**filt) : invalidFiltNC;
}